

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O2

void __thiscall argh::parser::add_params(parser *this,initializer_list<const_char_*const> init_list)

{
  long lVar1;
  allocator local_79;
  iterator local_78;
  string local_70;
  string local_50;
  
  local_78 = init_list._M_array;
  for (lVar1 = 0; init_list._M_len << 3 != lVar1; lVar1 = lVar1 + 8) {
    std::__cxx11::string::string((string *)&local_70,*(char **)((long)local_78 + lVar1),&local_79);
    trim_leading_dashes(&local_50,this,&local_70);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->registeredParams_,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

inline void parser::add_params(std::initializer_list<char const* const> init_list)
   {
      for (auto& name : init_list)
         registeredParams_.insert(trim_leading_dashes(name));
   }